

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltForCharException.cpp
# Opt level: O0

void __thiscall
antlr::NoViableAltForCharException::NoViableAltForCharException
          (NoViableAltForCharException *this,int c,string *fileName_,int line_,int column_)

{
  undefined4 in_ECX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  string *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  RecognitionException *in_stack_ffffffffffffffc0;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_ECX,in_R8D),in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  RecognitionException::RecognitionException
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  *in_RDI = &PTR__NoViableAltForCharException_004fbc08;
  *(undefined4 *)(in_RDI + 10) = in_ESI;
  return;
}

Assistant:

NoViableAltForCharException::NoViableAltForCharException(
					int c,
               const ANTLR_USE_NAMESPACE(std)string& fileName_,
					int line_, int column_)
  : RecognitionException("NoViableAlt",fileName_,line_,column_),
    foundChar(c)
{
}